

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool __thiscall
Fossilize::StateRecorder::Impl::copy_shader_module
          (Impl *this,VkShaderModuleCreateInfo *create_info,ScratchAllocator *alloc,
          bool ignore_pnext,VkShaderModuleCreateInfo **out_create_info)

{
  uint32_t *__src;
  void *pvVar1;
  size_t sVar2;
  VkShaderModuleCreateFlags VVar3;
  undefined4 uVar4;
  VkStructureType VVar5;
  undefined4 uVar6;
  bool bVar7;
  VkShaderModuleCreateInfo *pVVar8;
  void **out_pnext;
  uint32_t *__dest;
  ulong size;
  
  pVVar8 = (VkShaderModuleCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x28,0x10);
  if (pVVar8 != (VkShaderModuleCreateInfo *)0x0) {
    VVar5 = create_info->sType;
    uVar6 = *(undefined4 *)&create_info->field_0x4;
    pvVar1 = create_info->pNext;
    VVar3 = create_info->flags;
    uVar4 = *(undefined4 *)&create_info->field_0x14;
    sVar2 = create_info->codeSize;
    pVVar8->pCode = create_info->pCode;
    pVVar8->flags = VVar3;
    *(undefined4 *)&pVVar8->field_0x14 = uVar4;
    pVVar8->codeSize = sVar2;
    pVVar8->sType = VVar5;
    *(undefined4 *)&pVVar8->field_0x4 = uVar6;
    pVVar8->pNext = pvVar1;
  }
  out_pnext = &pVVar8->pNext;
  if (ignore_pnext) {
    *out_pnext = (void *)0x0;
  }
  else {
    bVar7 = copy_pnext_chain(this,*out_pnext,alloc,out_pnext,(DynamicStateInfo *)0x0,0);
    if (!bVar7) {
      return false;
    }
  }
  if (pVVar8->codeSize < 4) {
    __dest = (uint32_t *)0x0;
  }
  else {
    __src = pVVar8->pCode;
    size = pVVar8->codeSize & 0xfffffffffffffffc;
    __dest = (uint32_t *)ScratchAllocator::allocate_raw(alloc,size,0x10);
    if (__dest != (uint32_t *)0x0) {
      memmove(__dest,__src,size);
    }
  }
  pVVar8->pCode = __dest;
  *out_create_info = pVVar8;
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_shader_module(const VkShaderModuleCreateInfo *create_info, ScratchAllocator &alloc,
                                             bool ignore_pnext, VkShaderModuleCreateInfo **out_create_info)
{
	auto *info = copy(create_info, 1, alloc);

	if (ignore_pnext)
		info->pNext = nullptr;
	else if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	info->pCode = copy(info->pCode, info->codeSize / sizeof(uint32_t), alloc);

	*out_create_info = info;
	return true;
}